

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O3

ForLoopStatementSyntax * __thiscall
slang::parsing::Parser::parseForLoopStatement
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  Token openParen;
  Token semi1;
  Token semi2_00;
  bool bVar1;
  int iVar2;
  SyntaxNode *pSVar3;
  undefined8 uVar4;
  ExpressionSyntax *pEVar5;
  StatementSyntax *statement;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ForLoopStatementSyntax *pFVar6;
  __extent_storage<18446744073709551615UL> _Var7;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  TokenKind TVar8;
  bool bVar9;
  Token TVar10;
  SourceRange range;
  Token TVar11;
  Token forKeyword;
  string_view syntaxName;
  Token semi2;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> steps;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> initializers;
  Token local_268;
  Token local_258;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_248;
  ulong local_238;
  undefined8 uStack_230;
  SourceLocation local_228;
  pointer local_220;
  SourceLocation local_218;
  ExpressionSyntax *local_210;
  Info *local_208;
  undefined8 local_200;
  NamedLabelSyntax *local_1f8;
  Info *local_1f0;
  undefined8 local_1e8;
  pointer local_1e0;
  SourceLocation local_1d8;
  Token local_1d0;
  undefined8 local_1c0;
  Info *pIStack_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1b0;
  ulong local_1a0;
  undefined1 local_198 [96];
  Token local_138;
  Token local_128;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> local_118;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_e0 [2];
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> local_68;
  
  _Var7 = attributes._M_extent._M_extent_value;
  local_1e0 = attributes._M_ptr;
  local_1f8 = label;
  local_1d8 = (SourceLocation)_Var7._M_extent_value;
  TVar10 = ParserBase::consume(&this->super_ParserBase);
  local_208 = TVar10.info;
  local_200 = TVar10._0_8_;
  TVar10 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  local_1f0 = TVar10.info;
  local_1e8 = TVar10._0_8_;
  Token::Token(&local_268);
  local_e0[0].data_ = (pointer)local_e0[0].firstElement;
  local_e0[0].len = 0;
  local_e0[0].cap = 4;
  bVar1 = isVariableDeclaration(this);
  if (bVar1) {
    TVar10 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
    if (bVar1) {
      local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleForInitializer(TVar10.kind);
      if (bVar1) {
        local_1b0._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseForInitializer(this);
        local_1a0 = CONCAT71(local_1a0._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
        TVar11 = ParserBase::peek(&this->super_ParserBase);
        TVar8 = TVar11.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
        _Var7._M_extent_value._0_1_ = TVar8 != Comma || bVar1;
        if (TVar8 == Comma && !bVar1) {
          do {
            local_1b0._M_first._M_storage =
                 (_Uninitialized<slang::parsing::Token,_true>)
                 ParserBase::expect(&this->super_ParserBase,Comma);
            local_1a0 = local_1a0 & 0xffffffffffffff00;
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
            TVar11 = ParserBase::peek(&this->super_ParserBase);
            TVar8 = TVar11.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
            _Var7._M_extent_value._0_1_ = TVar8 != EndOfFile;
            if (TVar8 == EndOfFile || bVar1) {
              ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
              break;
            }
            bVar1 = TVar10.kind == TVar8;
            bVar9 = TVar10.info == TVar11.info;
            _Var7._M_extent_value._0_1_ = bVar9 && bVar1;
            if ((bVar9 && bVar1) &&
               (bVar1 = ParserBase::
                        skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleForInitializer,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                  (&this->super_ParserBase,(DiagCode)0x3c0005,true), !bVar1)) break;
            pSVar3 = parseForInitializer(this);
            local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
            local_1a0 = CONCAT71(local_1a0._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
            TVar10 = ParserBase::peek(&this->super_ParserBase);
            TVar8 = TVar10.kind;
            bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
            _Var7._M_extent_value._0_1_ = TVar8 == Comma;
            TVar10 = TVar11;
          } while (TVar8 == Comma && !bVar1);
        }
        local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        _Var7._M_extent_value = 0x13;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar10,Semicolon,&local_268,(DiagCode)0x3c0005);
      }
    }
  }
  else {
    TVar10 = ParserBase::peek(&this->super_ParserBase);
    bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
    if (bVar1) {
      local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    }
    else {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar10.kind);
      if (bVar1) {
        do {
          pSVar3 = &parseExpression(this)->super_SyntaxNode;
          if (pSVar3->kind != AssignmentExpression) {
            if (pSVar3->kind == IdentifierName) {
              TVar11 = slang::syntax::SyntaxNode::getFirstToken(pSVar3);
              if ((TVar11._0_4_ >> 0x10 & 1) != 0) goto LAB_0031a90d;
            }
            range = slang::syntax::SyntaxNode::sourceRange(pSVar3);
            _Var7._M_extent_value = (size_t)range.endLoc;
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x6d0005,range);
          }
LAB_0031a90d:
          local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
          local_1a0 = CONCAT71(local_1a0._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar11.kind);
          _Var7._M_extent_value._0_1_ = TVar11.kind != Comma || bVar1;
          if ((bool)_Var7._M_extent_value._0_1_) break;
          local_1b0._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_1a0 = local_1a0 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (local_e0,(TokenOrSyntax *)&local_1b0._M_first);
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          TVar8 = TVar11.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
          _Var7._M_extent_value._0_1_ = TVar8 != EndOfFile;
          if (TVar8 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          bVar1 = TVar10.kind == TVar8;
          bVar9 = TVar10.info == TVar11.info;
          _Var7._M_extent_value._0_1_ = bVar9 && bVar1;
          TVar10 = TVar11;
        } while ((!bVar9 || !bVar1) ||
                (bVar1 = ParserBase::
                         skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                   (&this->super_ParserBase,(DiagCode)0x3c0005,true), bVar1));
        local_268 = ParserBase::expect(&this->super_ParserBase,Semicolon);
      }
      else {
        _Var7._M_extent_value = 0x13;
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar10,Semicolon,&local_268,(DiagCode)0x3c0005);
      }
    }
  }
  Token::Token(&local_1d0);
  bVar1 = ParserBase::peek(&this->super_ParserBase,Semicolon);
  if (bVar1) {
    local_1d0 = ParserBase::consume(&this->super_ParserBase);
    pEVar5 = (ExpressionSyntax *)0x0;
  }
  else {
    pEVar5 = parseExpression(this);
    local_1d0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  }
  local_210 = pEVar5;
  Token::Token(&local_258);
  local_1b0._M_first._M_storage.info = (Info *)0x0;
  local_1b0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_198;
  local_1a0 = 4;
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar10.kind);
  if (bVar1) {
    local_258 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar10.kind);
    if (bVar1) {
      local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)parseExpression(this);
      local_238 = CONCAT71(local_238._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                 (TokenOrSyntax *)&local_248._M_first);
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      uVar4 = TVar11._0_8_;
      TVar8 = TVar11.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
      _Var7._M_extent_value._0_1_ = TVar8 == EndOfFile || bVar1;
      if (TVar8 != EndOfFile && !bVar1) {
        do {
          if ((short)uVar4 != 0x18) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_258 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                goto LAB_0031acd9;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_248._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_238 = local_238 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                     (TokenOrSyntax *)&local_248._M_first);
          TVar11 = ParserBase::peek(&this->super_ParserBase);
          TVar8 = TVar11.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
          _Var7._M_extent_value._0_1_ = TVar8 != EndOfFile;
          if (TVar8 == EndOfFile || bVar1) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            break;
          }
          bVar1 = TVar10.kind == TVar8;
          bVar9 = TVar10.info == TVar11.info;
          _Var7._M_extent_value._0_1_ = bVar9 && bVar1;
          if ((bVar9 && bVar1) &&
             (bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,true), !bVar1)) break;
          pEVar5 = parseExpression(this);
          local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
          local_238 = CONCAT71(local_238._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                     (TokenOrSyntax *)&local_248._M_first);
          TVar10 = ParserBase::peek(&this->super_ParserBase);
          uVar4 = TVar10._0_8_;
          TVar8 = TVar10.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar8);
          _Var7._M_extent_value._0_1_ = TVar8 != EndOfFile;
          TVar10 = TVar11;
        } while (TVar8 != EndOfFile && !bVar1);
      }
      local_258 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    }
    else {
      _Var7._M_extent_value = 0x12;
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar10,CloseParenthesis,&local_258,(DiagCode)0x10001);
    }
  }
LAB_0031acd9:
  statement = parseStatement(this,true,false);
  TVar10 = local_258;
  TVar11.info = (Info *)_Var7._M_extent_value;
  TVar11.kind = local_258.kind;
  TVar11._2_1_ = local_258._2_1_;
  TVar11.numFlags.raw = local_258.numFlags.raw;
  TVar11.rawLen = local_258.rawLen;
  syntaxName._M_str = "for loop";
  syntaxName._M_len = 8;
  local_258 = TVar10;
  checkEmptyBody(this,&statement->super_SyntaxNode,TVar11,syntaxName);
  local_248._8_4_ = 1;
  local_238 = 0;
  uStack_230 = 0;
  local_228 = local_1d8;
  local_220 = local_1e0;
  local_218 = local_1d8;
  local_248._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005b0da0;
  local_1c0 = local_1e8;
  pIStack_1b8 = local_1f0;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_e0,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  TVar11 = local_1d0;
  TVar10 = local_268;
  local_118.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar2);
  local_118.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_118.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_118.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b1848;
  local_128.kind = local_268.kind;
  local_128._2_1_ = local_268._2_1_;
  local_128.numFlags.raw = local_268.numFlags.raw;
  local_128.rawLen = local_268.rawLen;
  local_128.info = local_268.info;
  local_138.kind = local_1d0.kind;
  local_138._2_1_ = local_1d0._2_1_;
  local_138.numFlags.raw = local_1d0.numFlags.raw;
  local_138.rawLen = local_1d0.rawLen;
  local_138.info = local_1d0.info;
  local_268 = TVar10;
  local_1d0 = TVar11;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&local_1b0._M_first,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
  local_68.elements._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar2);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_005b12b0;
  openParen.info = pIStack_1b8;
  openParen.kind = (undefined2)local_1c0;
  openParen._2_1_ = local_1c0._2_1_;
  openParen.numFlags.raw = local_1c0._3_1_;
  openParen.rawLen = local_1c0._4_4_;
  semi1.info = local_128.info;
  semi1.kind = local_128.kind;
  semi1._2_1_ = local_128._2_1_;
  semi1.numFlags.raw = local_128.numFlags.raw;
  semi1.rawLen = local_128.rawLen;
  semi2_00.info = local_138.info;
  semi2_00.kind = local_138.kind;
  semi2_00._2_1_ = local_138._2_1_;
  semi2_00.numFlags.raw = local_138.numFlags.raw;
  semi2_00.rawLen = local_138.rawLen;
  forKeyword.info = local_208;
  forKeyword.kind = (undefined2)local_200;
  forKeyword._2_1_ = local_200._2_1_;
  forKeyword.numFlags.raw = local_200._3_1_;
  forKeyword.rawLen = local_200._4_4_;
  pFVar6 = slang::syntax::SyntaxFactory::forLoopStatement
                     (&this->factory,local_1f8,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_248._M_first,
                      forKeyword,openParen,&local_118,semi1,local_210,semi2_00,&local_68,local_258,
                      statement);
  if (local_1b0._M_rest != (_Variadic_union<const_slang::syntax::SyntaxNode_*>)local_198) {
    operator_delete((void *)local_1b0._M_rest);
  }
  if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
    operator_delete(local_e0[0].data_);
  }
  return pFVar6;
}

Assistant:

ForLoopStatementSyntax& Parser::parseForLoopStatement(NamedLabelSyntax* label,
                                                      AttrList attributes) {
    auto forKeyword = consume();
    auto openParen = expect(TokenKind::OpenParenthesis);

    Token semi1;
    SmallVector<TokenOrSyntax, 4> initializers;

    if (isVariableDeclaration()) {
        parseList<isPossibleForInitializer, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] { return &parseForInitializer(); });
    }
    else {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            initializers, TokenKind::Semicolon, TokenKind::Comma, semi1, RequireItems::False,
            diag::ExpectedForInitializer, [this] {
                auto& expr = parseExpression();
                if (expr.kind != SyntaxKind::AssignmentExpression &&
                    (expr.kind != SyntaxKind::IdentifierName ||
                     !expr.getFirstToken().isMissing())) {
                    // Initializer expressions must be variable assignments.
                    addDiag(diag::InvalidForInitializer, expr.sourceRange());
                }
                return &expr;
            });
    }

    ExpressionSyntax* stopExpr = nullptr;
    Token semi2;
    if (peek(TokenKind::Semicolon)) {
        semi2 = consume();
    }
    else {
        stopExpr = &parseExpression();
        semi2 = expect(TokenKind::Semicolon);
    }

    Token closeParen;
    SmallVector<TokenOrSyntax, 4> steps;
    parseList<isPossibleExpressionOrComma, isEndOfParenList>(
        steps, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedExpression, [this] { return &parseExpression(); });

    auto& body = parseStatement();

    checkEmptyBody(body, closeParen, "for loop"sv);

    return factory.forLoopStatement(label, attributes, forKeyword, openParen,
                                    initializers.copy(alloc), semi1, stopExpr, semi2,
                                    steps.copy(alloc), closeParen, body);
}